

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O0

string * __thiscall
Reflection::StructImpl<Enterprise::Machine::Options>::name_of_abi_cxx11_
          (string *__return_storage_ptr__,StructImpl<Enterprise::Machine::Options> *this,void *field
          )

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Enterprise::Machine::Options>::Field>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Enterprise::Machine::Options>::Field>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Enterprise::Machine::Options>::Field>,_true>
  local_30;
  iterator iterator;
  ssize_t offset;
  void *field_local;
  StructImpl<Enterprise::Machine::Options> *this_local;
  
  iterator.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Enterprise::Machine::Options>::Field>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Enterprise::Machine::Options>::Field>,_true>
             )((long)field - (long)this);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Enterprise::Machine::Options>::Field,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Enterprise::Machine::Options>::Field>_>_>
       ::begin(&contents__abi_cxx11_);
  while( true ) {
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Enterprise::Machine::Options>::Field,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Enterprise::Machine::Options>::Field>_>_>
         ::end(&contents__abi_cxx11_);
    bVar1 = std::__detail::operator!=(&local_30,&local_38);
    if ((!bVar1) ||
       (ppVar2 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Enterprise::Machine::Options>::Field>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Enterprise::Machine::Options>::Field>,_false,_true>
                               *)&local_30),
       (__node_type *)(ppVar2->second).offset ==
       iterator.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Enterprise::Machine::Options>::Field>,_true>
       ._M_cur)) break;
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Enterprise::Machine::Options>::Field>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Enterprise::Machine::Options>::Field>,_false,_true>
                  *)&local_30);
  }
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Enterprise::Machine::Options>::Field,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Enterprise::Machine::Options>::Field>_>_>
       ::end(&contents__abi_cxx11_);
  bVar1 = std::__detail::operator!=(&local_30,&local_40);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Enterprise::Machine::Options>::Field>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Enterprise::Machine::Options>::Field>,_false,_true>
                           *)&local_30);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)ppVar2);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string name_of(void *field) {
			const ssize_t offset = reinterpret_cast<uint8_t *>(field) - reinterpret_cast<uint8_t *>(this);

			auto iterator = contents_.begin();
			while(iterator != contents_.end()) {
				if(iterator->second.offset == offset) break;
				++iterator;
			}

			if(iterator != contents_.end()) {
				return iterator->first;
			} else {
				return std::string();
			}
		}